

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::RegisterOperand::display(RegisterOperand *this,ostream *o)

{
  ostream *this_00;
  ostream *in_RSI;
  long in_RDI;
  Reg in_stack_0000001c;
  ostream *in_stack_00000020;
  
  display_reg_name(in_stack_00000020,in_stack_0000001c);
  if ((*(char *)(in_RDI + 0xc) != '\x01') || (*(char *)(in_RDI + 0xd) != '\0')) {
    std::operator<<(in_RSI,", ");
    display_shift(in_RSI,(RegisterShiftKind)((ulong)in_RDI >> 0x38));
    if (*(char *)(in_RDI + 0xc) != '\x04') {
      this_00 = std::operator<<(in_RSI," #");
      std::ostream::operator<<(this_00,(uint)*(byte *)(in_RDI + 0xd));
    }
  }
  return;
}

Assistant:

void RegisterOperand::display(std::ostream &o) const {
  display_reg_name(o, reg);
  if (shift != RegisterShiftKind::Lsl || shift_amount != 0) {
    o << ", ";
    display_shift(o, shift);
    if (shift != RegisterShiftKind::Rrx) {
      o << " #" << (unsigned int)shift_amount;
    }
  }
}